

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

Instr * __thiscall Inline::InlineSpread(Inline *this,Instr *spreadCall)

{
  StackSym *this_00;
  Instr *bailOutTarget;
  Func *func;
  _func_int **pp_Var1;
  _func_int *p_Var2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  byte bVar6;
  ArgSlot AVar7;
  undefined4 *puVar8;
  JITTimeFunctionBody *pJVar9;
  Instr *this_01;
  BailOutInstrTemplate<IR::Instr> *instr;
  Opnd *pOVar10;
  
  bVar4 = Lowerer::IsSpreadCall(spreadCall);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x16fe,"(Lowerer::IsSpreadCall(spreadCall))",
                       "Lowerer::IsSpreadCall(spreadCall)");
    if (!bVar4) goto LAB_00544716;
    *puVar8 = 0;
  }
  pJVar9 = JITTimeWorkItem::GetJITFunctionBody(spreadCall->m_func->m_workItem);
  bVar4 = JITTimeFunctionBody::IsInlineSpreadDisabled(pJVar9);
  if (!bVar4) {
    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
    bVar4 = JITTimeFunctionBody::IsInlineSpreadDisabled(pJVar9);
    if (bVar4) {
      return spreadCall;
    }
    this_01 = Lowerer::GetLdSpreadIndicesInstr(spreadCall);
    pOVar10 = this_01->m_src1;
    OVar5 = IR::Opnd::GetKind(pOVar10);
    if (OVar5 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar4) goto LAB_00544716;
      *puVar8 = 0;
    }
    if (*(byte *)((long)&pOVar10[2].m_valueType.field_0.bits + 1) != 0x20) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x1709,
                         "(spreadIndicesOpnd->AsAddrOpnd()->GetAddrOpndKind() == IR::AddrOpndKindDynamicAuxBufferRef)"
                         ,
                         "spreadIndicesOpnd->AsAddrOpnd()->GetAddrOpndKind() == IR::AddrOpndKindDynamicAuxBufferRef"
                        );
      if (!bVar4) goto LAB_00544716;
      *puVar8 = 0;
    }
    OVar5 = IR::Opnd::GetKind(pOVar10);
    if (OVar5 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar4) goto LAB_00544716;
      *puVar8 = 0;
    }
    if (*(int *)pOVar10[1]._vptr_Opnd == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x170c,"(spreadIndices->count > 0)","spreadIndices->count > 0");
      if (!bVar4) goto LAB_00544716;
      *puVar8 = 0;
    }
    pOVar10 = this_01->m_src2;
    OVar5 = IR::Opnd::GetKind(pOVar10);
    if (OVar5 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_00544716;
      *puVar8 = 0;
    }
    this_00 = (StackSym *)pOVar10[1]._vptr_Opnd;
    if ((this_00->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar4) goto LAB_00544716;
      *puVar8 = 0;
    }
    bailOutTarget = (this_00->field_5).m_instrDef;
    AVar7 = StackSym::GetArgSlotNum(this_00);
    if (2 < AVar7) {
      return spreadCall;
    }
    IR::Instr::ReplaceSrc2(spreadCall,pOVar10);
    IR::Instr::Remove(this_01);
    pOVar10 = bailOutTarget->m_src1;
    bailOutTarget->m_opcode = ArgOut_A_SpreadArg;
    instr = IR::BailOutInstrTemplate<IR::Instr>::New
                      (BailOnNotSpreadable,BailOutOnInlineFunction,bailOutTarget,
                       bailOutTarget->m_func);
    if ((instr->super_Instr).m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_00544716;
      *puVar8 = 0;
    }
    func = (instr->super_Instr).m_func;
    if (pOVar10->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) goto LAB_00544716;
      *puVar8 = 0;
    }
    bVar6 = pOVar10->field_0xb;
    if ((bVar6 & 2) != 0) {
      pOVar10 = IR::Opnd::Copy(pOVar10,func);
      bVar6 = pOVar10->field_0xb;
    }
    pOVar10->field_0xb = bVar6 | 2;
    (instr->super_Instr).m_src1 = pOVar10;
    IR::Instr::InsertBefore(bailOutTarget,&instr->super_Instr);
    pOVar10 = bailOutTarget->m_src2;
    OVar5 = IR::Opnd::GetKind(pOVar10);
    if (OVar5 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_00544716;
      *puVar8 = 0;
    }
    pp_Var1 = pOVar10[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar4) goto LAB_00544716;
      *puVar8 = 0;
    }
    p_Var2 = pp_Var1[5];
    *(undefined2 *)(p_Var2 + 0x30) = 0x1f0;
    pOVar10 = *(Opnd **)(p_Var2 + 0x50);
    OVar5 = IR::Opnd::GetKind(pOVar10);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_00544716;
      *puVar8 = 0;
    }
    pp_Var1 = pOVar10[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar4) goto LAB_00544716;
      *puVar8 = 0;
    }
    if (*(short *)(pp_Var1[5] + 0x30) != 7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x172e,"(argInstr->m_opcode == Js::OpCode::StartCall)",
                         "argInstr->m_opcode == Js::OpCode::StartCall");
      if (!bVar4) {
LAB_00544716:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
    spreadCall->m_opcode = CallIDynamicSpread;
  }
  return spreadCall;
}

Assistant:

IR::Instr *
Inline::InlineSpread(IR::Instr *spreadCall)
{
    Assert(Lowerer::IsSpreadCall(spreadCall));

    if (spreadCall->m_func->GetJITFunctionBody()->IsInlineSpreadDisabled()
        || this->topFunc->GetJITFunctionBody()->IsInlineSpreadDisabled())
    {
        return spreadCall;
    }

    IR::Instr *spreadIndicesInstr = Lowerer::GetLdSpreadIndicesInstr(spreadCall);

    IR::Opnd *spreadIndicesOpnd = spreadIndicesInstr->GetSrc1();
    Assert(spreadIndicesOpnd->AsAddrOpnd()->GetAddrOpndKind() == IR::AddrOpndKindDynamicAuxBufferRef);

    Js::AuxArray<uint32>* spreadIndices = static_cast<Js::AuxArray<uint32>*>(spreadIndicesOpnd->AsAddrOpnd()->m_metadata);
    Assert(spreadIndices->count > 0);

    IR::Instr *argInstr = spreadIndicesInstr;

    IR::SymOpnd *argLinkOpnd = argInstr->GetSrc2()->AsSymOpnd();
    StackSym *argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
    argInstr = argLinkSym->m_instrDef;

    // We only support one spread argument for inlining.
    if (argLinkSym->GetArgSlotNum() > 2)
    {
        return spreadCall;
    }

    // We are now committed to inlining spread. Remove the LdSpreadIndices instr
    // and convert the spread and 'this' ArgOuts.
    spreadCall->ReplaceSrc2(argLinkOpnd);
    spreadIndicesInstr->Remove();

    // Insert the bailout before the array ArgOut
    IR::Opnd *arrayOpnd = argInstr->GetSrc1();
    argInstr->m_opcode = Js::OpCode::ArgOut_A_SpreadArg;
    IR::Instr *bailoutInstr = IR::BailOutInstr::New(Js::OpCode::BailOnNotSpreadable, IR::BailOutOnInlineFunction, argInstr, argInstr->m_func);
    bailoutInstr->SetSrc1(arrayOpnd);
    argInstr->InsertBefore(bailoutInstr);

    argLinkOpnd = argInstr->GetSrc2()->AsSymOpnd();
    argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
    argInstr = argLinkSym->m_instrDef;
    argInstr->m_opcode = Js::OpCode::ArgOut_A_Dynamic;

    IR::RegOpnd *startCallDstOpnd = argInstr->GetSrc2()->AsRegOpnd();
    argLinkSym = startCallDstOpnd->m_sym->AsStackSym();
    argInstr = argLinkSym->m_instrDef;
    Assert(argInstr->m_opcode == Js::OpCode::StartCall);

    spreadCall->m_opcode = Js::OpCode::CallIDynamicSpread;

    return spreadCall;
}